

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

void __thiscall re2::PCRE::PCRE(PCRE *this,string *pattern)

{
  char *pattern_00;
  string *pattern_local;
  PCRE *this_local;
  
  std::__cxx11::string::string((string *)this);
  pattern_00 = (char *)std::__cxx11::string::c_str();
  Init(this,pattern_00,EnabledExecOptions,0,0,true);
  return;
}

Assistant:

PCRE::PCRE(const string& pattern) {
  Init(pattern.c_str(), None, 0, 0, true);
}